

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->b).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->a).b.d);
  return;
}

Assistant:

~QStringBuilder() = default;